

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

void Zyx_ManExactSynthesis(Bmc_EsPar_t *pPars)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  abctime aVar4;
  Zyx_Man_t *p;
  word *pwVar5;
  word *pwVar6;
  word *pIn2;
  abctime aVar7;
  int iVar8;
  uint uVar9;
  Bmc_EsPar_t *pBVar10;
  abctime time;
  int (*paiVar11) [32];
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  ulong in_R9;
  uint uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  uint local_128;
  int local_124;
  ulong local_118;
  long local_108;
  word *local_e8 [6];
  word pTruth [16];
  
  aVar4 = Abc_Clock();
  local_108 = Abc_Clock();
  if (pPars->fMajority == 0) {
    Abc_TtReadHex(pTruth,pPars->pTtStr);
    local_124 = 0;
    iVar8 = pPars->nVars;
    if (((byte)pTruth[0] & 1) != 0) {
      local_124 = 1;
      iVar3 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        iVar3 = local_124;
      }
      Abc_TtNot(pTruth,iVar3);
    }
  }
  else {
    iVar8 = pPars->nVars;
    local_124 = 0;
  }
  if (10 < iVar8) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMaj3.c"
                  ,0x4f8,"void Zyx_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  if (6 < pPars->nLutSize) {
    __assert_fail("pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMaj3.c"
                  ,0x4f9,"void Zyx_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  iVar8 = 0;
  pwVar5 = pTruth;
  if (pPars->fMajority != 0) {
    pwVar5 = (word *)0x0;
  }
  p = Zyx_ManAlloc(pPars,pwVar5);
  pBVar10 = p->pPars;
  pcVar15 = "MAJ-gates";
  if (pBVar10->fMajority == 0) {
    pcVar15 = "LUTs";
  }
  printf("Running exact synthesis for %d-input function with %d %d-input %s...\n",
         (ulong)(uint)pBVar10->nVars,(ulong)(uint)pBVar10->nNodes,(ulong)(uint)pBVar10->nLutSize,
         pcVar15);
  local_118 = 0;
  uVar13 = 0;
  local_128 = 0;
LAB_00486087:
  do {
    iVar12 = (int)uVar13;
    iVar3 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
    if (iVar3 == 1) {
      iVar3 = Zyx_ManAddCnfLazyTopo(p);
      if (iVar3 != 0) {
        if (iVar3 == -1) {
          puts("Became UNSAT after adding lazy constraints.");
          goto LAB_004864af;
        }
        iVar8 = iVar8 + iVar3;
        goto LAB_00486087;
      }
    }
    else if (iVar3 == -1) goto LAB_004864af;
    lVar17 = (long)p->pPars->nVars;
    paiVar11 = p->pFanins + lVar17;
    for (; iVar3 = p->nObjs, lVar17 < iVar3; lVar17 = lVar17 + 1) {
      iVar12 = (int)lVar17;
      iVar3 = Zyx_ManCollectFanins(p,iVar12);
      pBVar10 = p->pPars;
      if (iVar3 != pBVar10->nLutSize) {
        __assert_fail("nFanins == p->pPars->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x4b5,"int Zyx_ManEval(Zyx_Man_t *)");
      }
      for (lVar18 = 0; lVar18 < iVar3; lVar18 = lVar18 + 1) {
        pwVar5 = Zyx_ManTruth(p,(*paiVar11)[lVar18]);
        local_e8[lVar18] = pwVar5;
        pBVar10 = p->pPars;
        iVar3 = pBVar10->nLutSize;
      }
      iVar3 = pBVar10->fMajority;
      pwVar5 = Zyx_ManTruth(p,iVar12);
      if (iVar3 == 0) {
        Abc_TtConst0(pwVar5,p->nWords);
        for (uVar16 = 1; (int)uVar16 <= p->LutMask; uVar16 = uVar16 + 1) {
          iVar3 = bmcg_sat_solver_read_cex_varvalue
                            (p->pSat,(iVar12 - p->pPars->nVars) * (p->LutMask + 1) + uVar16);
          if (iVar3 != 0) {
            pwVar5 = Zyx_ManTruth(p,p->nObjs);
            Abc_TtConst1(pwVar5,p->nWords);
            for (lVar18 = 0; lVar18 < p->pPars->nLutSize; lVar18 = lVar18 + 1) {
              pwVar5 = Zyx_ManTruth(p,p->nObjs);
              pwVar6 = Zyx_ManTruth(p,p->nObjs);
              Abc_TtAndCompl(pwVar5,pwVar6,(int)local_e8[lVar18],
                             (word *)(ulong)((~uVar16 >> ((uint)lVar18 & 0x1f) & 1) != 0),p->nWords,
                             (int)in_R9);
            }
            pwVar5 = Zyx_ManTruth(p,iVar12);
            pwVar6 = Zyx_ManTruth(p,iVar12);
            pIn2 = Zyx_ManTruth(p,p->nObjs);
            Abc_TtOr(pwVar5,pwVar6,pIn2,p->nWords);
          }
        }
      }
      else {
        Abc_TtMaj(pwVar5,local_e8[0],local_e8[1],local_e8[2],p->nWords);
      }
      paiVar11 = paiVar11 + 1;
    }
    if (p->pPars->fMajority == 0) {
      pwVar5 = p->pTruth;
LAB_004862c7:
      pwVar6 = Zyx_ManTruth(p,iVar3 + -1);
      iVar3 = p->pPars->nVars;
      bVar2 = (byte)iVar3;
      bVar1 = bVar2 - 6 & 0x1f;
      uVar9 = 0;
      uVar16 = 1 << bVar1;
      if (1 << bVar1 < 1) {
        uVar16 = uVar9;
      }
      uVar13 = (ulong)uVar16;
      if (iVar3 < 7) {
        uVar13 = 1;
      }
      for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
        in_R9 = pwVar6[uVar14];
        if (in_R9 != pwVar5[uVar14]) {
          uVar14 = pwVar5[uVar14] ^ in_R9;
          bVar19 = (int)uVar14 == 0;
          uVar13 = uVar14 >> 0x20;
          if (!bVar19) {
            uVar13 = uVar14;
          }
          iVar12 = (uint)bVar19 * 0x20;
          iVar3 = iVar12 + 0x10;
          uVar14 = uVar13 >> 0x10;
          if ((short)uVar13 != 0) {
            iVar3 = iVar12;
            uVar14 = uVar13;
          }
          iVar12 = iVar3 + 8;
          uVar13 = uVar14 >> 8;
          if ((char)uVar14 != '\0') {
            iVar12 = iVar3;
            uVar13 = uVar14;
          }
          iVar3 = iVar12 + 4;
          uVar14 = uVar13 >> 4;
          if ((uVar13 & 0xf) != 0) {
            iVar3 = iVar12;
            uVar14 = uVar13;
          }
          uVar16 = (uint)(uVar14 >> 2) & 0x3fffffff;
          iVar12 = iVar3 + 2;
          if ((uVar14 & 3) != 0) {
            uVar16 = (uint)uVar14;
            iVar12 = iVar3;
          }
          uVar13 = (ulong)(((~uVar16 & 1) + iVar12) - uVar9);
          goto LAB_00486387;
        }
        uVar9 = uVar9 - 0x40;
      }
      uVar13 = 0xffffffff;
LAB_00486387:
      if (1 << (bVar2 & 0x1f) <= (int)uVar13) {
        __assert_fail("iMint < (1 << p->pPars->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x4d7,"int Zyx_ManEval(Zyx_Man_t *)");
      }
    }
    else {
      pwVar5 = Zyx_ManTruth(p,iVar3);
      if (p->pPars->fMajority == 0) {
        iVar3 = p->nObjs;
        goto LAB_004862c7;
      }
      iVar3 = 0;
      do {
        if (p->vMidMints->nSize <= iVar3) goto LAB_004863ba;
        uVar16 = Vec_IntEntry(p->vMidMints,iVar3);
        uVar13 = (ulong)uVar16;
        uVar14 = pwVar5[(int)uVar16 >> 6];
        pwVar6 = Zyx_ManTruth(p,p->nObjs + -1);
        iVar3 = iVar3 + 1;
      } while (((uVar14 ^ pwVar6[(int)uVar16 >> 6]) >> (uVar13 & 0x3f) & 1) == 0);
    }
    iVar12 = (int)uVar13;
    if (iVar12 == -1) {
LAB_004863ba:
      if (pPars->fEnumSols != 0) {
        uVar13 = 0xffffffffffffffff;
        if (pPars->fVerbose != 0) {
          aVar7 = Abc_Clock();
          Zyx_ManPrint(p,local_128,-1,iVar8,aVar7 - aVar4);
          local_108 = Abc_Clock();
        }
        iVar3 = (int)local_118;
        uVar16 = iVar3 + 1;
        local_118 = (ulong)uVar16;
        Zyx_ManPrintSolution(p,local_124,(uint)(iVar3 == 0));
        iVar3 = Zyx_ManAddCnfBlockSolution(p);
        if (iVar3 != 0) goto LAB_0048649b;
        local_118 = (ulong)uVar16;
      }
      iVar12 = -1;
LAB_004864af:
      if (pPars->fVerbose != 0) {
        aVar7 = Abc_Clock();
        Zyx_ManPrint(p,local_128,iVar12,iVar8,aVar7 - aVar4);
      }
      if (pPars->fEnumSols == 0) {
        if (iVar12 == -1) {
          Zyx_ManPrintSolution(p,local_124,1);
        }
        else {
          puts("The problem has no solution.");
        }
      }
      else {
        printf("Finished enumerating %d solutions.\n",local_118);
      }
      printf("Added = %d.  Tried = %d.  ",(ulong)(uint)p->nUsed[1],(ulong)(uint)p->nUsed[0]);
      aVar7 = Abc_Clock();
      Abc_PrintTime(0x77bdf7,(char *)(aVar7 - aVar4),time);
      Zyx_ManFree(p);
      return;
    }
    if (pPars->fUseIncr == 0) {
      iVar3 = Zyx_ManAddCnfLazyFunc(p,iVar12);
    }
    else {
      iVar3 = Zyx_ManAddCnfLazyFunc2(p,iVar12);
    }
    if (iVar3 == 0) {
      printf("Became UNSAT after adding constraints for minterm %d\n",uVar13);
      goto LAB_004864af;
    }
    iVar3 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
    if ((pPars->fVerbose != 0) && ((pPars->fUseIncr == 0 || (local_128 % 100 == 0)))) {
      aVar7 = Abc_Clock();
      Zyx_ManPrint(p,local_128,iVar12,iVar8,aVar7 - local_108);
      local_108 = Abc_Clock();
    }
    if (iVar3 == -1) goto LAB_004864af;
LAB_0048649b:
    local_128 = local_128 + 1;
  } while( true );
}

Assistant:

void Zyx_ManExactSynthesis( Bmc_EsPar_t * pPars )
{
    int status, Iter, iMint = 0, fCompl = 0, nLazyAll = 0, nSols = 0;
    abctime clkTotal = Abc_Clock(), clk = Abc_Clock();  Zyx_Man_t * p; 
    word pTruth[16]; 
    if ( !pPars->fMajority )
    {
        Abc_TtReadHex( pTruth, pPars->pTtStr );
        if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, Abc_TtWordNum(pPars->nVars) ); }
    }
    assert( pPars->nVars <= 10 );
    assert( pPars->nLutSize <= 6 );
    p = Zyx_ManAlloc( pPars, pPars->fMajority ? NULL : pTruth );
    printf( "Running exact synthesis for %d-input function with %d %d-input %s...\n", 
        p->pPars->nVars, p->pPars->nNodes, p->pPars->nLutSize, p->pPars->fMajority ? "MAJ-gates" : "LUTs" );
    for ( Iter = 0 ; ; Iter++ )
    {
        while ( (status = bmcg_sat_solver_solve(p->pSat, NULL, 0)) == GLUCOSE_SAT )
        {
            int nLazy = Zyx_ManAddCnfLazyTopo( p );
            if ( nLazy == -1 )
            {
                printf( "Became UNSAT after adding lazy constraints.\n" );
                status = GLUCOSE_UNSAT;
                break;
            }
            //printf( "Added %d lazy constraints.\n\n", nLazy );
            if ( nLazy == 0 )
                break;
            nLazyAll += nLazy;
        }
        if ( status == GLUCOSE_UNSAT )
            break;
        // find mismatch
        iMint = Zyx_ManEval( p );
        if ( iMint == -1 )
        {
            if ( pPars->fEnumSols )
            {
                nSols++;
                if ( pPars->fVerbose )
                {
                    Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clkTotal );
                    clk = Abc_Clock();
                }
                Zyx_ManPrintSolution( p, fCompl, nSols==1 );
                if ( !Zyx_ManAddCnfBlockSolution( p ) )
                {
                    status = GLUCOSE_UNSAT;
                    break;
                }
                continue;
            }
            else
                break;
        }
        if ( pPars->fUseIncr ? !Zyx_ManAddCnfLazyFunc2(p, iMint) : !Zyx_ManAddCnfLazyFunc(p, iMint) )
        {
            printf( "Became UNSAT after adding constraints for minterm %d\n", iMint );
            status = GLUCOSE_UNSAT;
            break;
        }
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( pPars->fVerbose && (!pPars->fUseIncr || Iter % 100 == 0) )
        {
            Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clk );
            clk = Abc_Clock();
        }
        if ( status == GLUCOSE_UNSAT )
            break;
    }
    if ( pPars->fVerbose )
        Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clkTotal );
    if ( pPars->fEnumSols )
        printf( "Finished enumerating %d solutions.\n", nSols );
    else if ( iMint == -1 )
        Zyx_ManPrintSolution( p, fCompl, 1 );
    else
        printf( "The problem has no solution.\n" );
    //Zyx_ManEvalStats( p );
    printf( "Added = %d.  Tried = %d.  ", p->nUsed[1], p->nUsed[0] );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    Zyx_ManFree( p );
}